

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Slice_x86_avx::forward
          (Slice_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  uint uVar2;
  int _elempack;
  Mat *src;
  ulong _elemsize;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  pointer pMVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  void *pvVar26;
  undefined4 *puVar27;
  void *pvVar28;
  ulong uVar29;
  long lVar30;
  void *pvVar31;
  int iVar32;
  void *pvVar33;
  void *pvVar34;
  int iVar35;
  long lVar36;
  void *pvVar37;
  long lVar38;
  bool bVar39;
  undefined1 local_b8 [56];
  int local_80;
  size_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar2 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar5 = (ulong)_elempack;
  lVar38 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86_avx[-3]);
  iVar10 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86_avx[-3]);
  if (uVar2 == 1) {
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    if (lVar11 != 0) {
      iVar16 = src->w;
      uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar11 = 0;
      lVar36 = 0;
      iVar32 = 0;
      uVar29 = 0;
      do {
        uVar9 = *(uint *)(lVar38 + uVar29 * 4);
        uVar6 = (ulong)uVar9;
        if (uVar9 == 0xffffff17) {
          uVar6 = (ulong)(long)(iVar16 * _elempack - iVar32) / (uVar12 + lVar36);
        }
        uVar9 = 1;
        if ((opt->use_packing_layout == true) &&
           (uVar9 = (uint)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
          uVar9 = 8;
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar11),
                    (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)(int)uVar9),(ulong)uVar9 * (_elemsize / uVar5),uVar9,
                    opt->blob_allocator);
        pvVar33 = *(void **)((long)&pMVar8->data + lVar11);
        if (pvVar33 == (void *)0x0) {
          bVar39 = true;
        }
        else {
          bVar39 = (long)*(int *)((long)&pMVar8->c + lVar11) *
                   *(long *)((long)&pMVar8->cstep + lVar11) == 0;
        }
        if (bVar39) {
          return -100;
        }
        memcpy(pvVar33,(void *)((long)iVar32 * 4 + (long)src->data),
               (long)*(int *)((long)&pMVar8->w + lVar11) *
               *(long *)((long)&pMVar8->elemsize + lVar11));
        iVar32 = (int)uVar6 + iVar32;
        uVar29 = uVar29 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar36 = lVar36 + -1;
        lVar11 = lVar11 + 0x48;
      } while (uVar29 < uVar12);
    }
  }
  iVar10 = (iVar10 >> 0x1f & uVar2) + iVar10;
  if ((uVar2 == 2) && (iVar10 == 0)) {
    iVar16 = src->w;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    bVar39 = lVar11 != 0;
    if (bVar39) {
      iVar32 = src->h;
      uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar36 = 0;
      lVar11 = 0;
      iVar18 = 0;
      uVar29 = 0;
      do {
        uVar9 = *(uint *)(lVar38 + uVar29 * 4);
        uVar6 = (ulong)uVar9;
        if (uVar9 == 0xffffff17) {
          uVar6 = (ulong)(long)(iVar32 * _elempack - iVar18) / (uVar12 + lVar11);
        }
        lVar21 = 1;
        if ((opt->use_packing_layout == true) &&
           (lVar21 = (ulong)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
          lVar21 = 8;
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar36),iVar16,
                    (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)(int)lVar21),lVar21 * (_elemsize / uVar5),(int)lVar21,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar36) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar36) * *(long *)((long)&pMVar8->cstep + lVar36) ==
            0) {
          return -100;
        }
        iVar18 = iVar18 + (int)uVar6;
        uVar29 = uVar29 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar36 = lVar36 + 0x48;
        bVar39 = uVar29 < uVar12;
      } while (bVar39);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar32 = pMVar8->elempack;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    if (lVar11 != 0) {
      lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      piVar7 = &pMVar8->elempack;
      do {
        if (*piVar7 < iVar32) {
          iVar32 = *piVar7;
        }
        piVar7 = piVar7 + 0x12;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    piVar7 = src->refcount;
    local_b8._0_8_ = src->data;
    local_b8._8_4_ = SUB84(src->refcount,0);
    local_b8._12_4_ = (undefined4)((ulong)src->refcount >> 0x20);
    local_b8._16_4_ = (undefined4)src->elemsize;
    local_b8._20_4_ = (undefined4)(src->elemsize >> 0x20);
    local_b8._24_4_ = src->elempack;
    local_b8._32_8_ = src->allocator;
    local_b8._40_4_ = src->dims;
    local_b8._44_4_ = src->w;
    local_b8._48_4_ = src->h;
    local_b8._52_4_ = src->d;
    local_80 = src->c;
    local_78 = src->cstep;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    if (iVar32 < _elempack) {
      convert_packing(src,(Mat *)local_b8,iVar32,opt);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar8) {
      local_38 = (long)iVar16;
      lVar36 = (long)(iVar16 * 8) * 4;
      local_70 = (long)(iVar16 * 4) * 4 + 0xc;
      lVar11 = (long)(iVar16 * 4) * 4;
      local_68 = local_38 * 4;
      local_58 = (long)(iVar16 * 2) << 2;
      local_60 = (long)(iVar16 * 3) << 2;
      local_40 = (long)(iVar16 * 5) << 2;
      local_48 = (long)(iVar16 * 6) << 2;
      local_50 = (long)(iVar16 * 7) << 2;
      uVar12 = 0;
      pvVar33 = (void *)local_b8._0_8_;
      do {
        pMVar1 = pMVar8 + uVar12;
        if (((iVar32 == 4) && (pMVar8[uVar12].elempack == 8)) &&
           (iVar18 = pMVar1->h, 0 < (long)iVar18)) {
          pvVar13 = pMVar1->data;
          iVar35 = pMVar1->w;
          sVar3 = pMVar1->elemsize;
          lVar21 = 0;
          do {
            if (0 < iVar16) {
              lVar24 = 0;
              iVar20 = iVar16;
              do {
                *(undefined4 *)((long)pvVar13 + lVar24 * 2) =
                     *(undefined4 *)((long)pvVar33 + lVar24);
                *(undefined4 *)((long)pvVar13 + lVar24 * 2 + 4) =
                     *(undefined4 *)((long)pvVar33 + lVar24 + 4);
                *(undefined4 *)((long)pvVar13 + lVar24 * 2 + 8) =
                     *(undefined4 *)((long)pvVar33 + lVar24 + 8);
                *(undefined4 *)((long)pvVar13 + lVar24 * 2 + 0xc) =
                     *(undefined4 *)((long)pvVar33 + lVar24 + 0xc);
                *(undefined4 *)((long)pvVar13 + lVar24 * 2 + 0x10) =
                     *(undefined4 *)((long)pvVar33 + lVar24 + local_70 + -0xc);
                *(undefined4 *)((long)pvVar13 + lVar24 * 2 + 0x14) =
                     *(undefined4 *)((long)pvVar33 + lVar24 + local_70 + -8);
                *(undefined4 *)((long)pvVar13 + lVar24 * 2 + 0x18) =
                     *(undefined4 *)((long)pvVar33 + lVar24 + local_70 + -4);
                *(undefined4 *)((long)pvVar13 + lVar24 * 2 + 0x1c) =
                     *(undefined4 *)((long)pvVar33 + lVar24 + local_70);
                lVar24 = lVar24 + 0x10;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            pvVar33 = (void *)((long)pvVar33 + lVar36);
            lVar21 = lVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)iVar35 * sVar3);
          } while (lVar21 != iVar18);
        }
        if (((iVar32 == 1) && (pMVar1->elempack == 8)) && (iVar18 = pMVar1->h, 0 < (long)iVar18)) {
          pvVar14 = pMVar1->data;
          iVar35 = pMVar1->w;
          lVar21 = local_68 + (long)pvVar33;
          lVar19 = (long)pvVar33 + local_58;
          lVar22 = (long)pvVar33 + local_60;
          pvVar13 = (void *)((long)pvVar33 + lVar11);
          lVar25 = (long)pvVar33 + local_40;
          lVar24 = local_48 + (long)pvVar33;
          lVar30 = local_50 + (long)pvVar33;
          sVar3 = pMVar1->elemsize;
          lVar17 = 0;
          do {
            if (0 < iVar16) {
              lVar15 = 0;
              iVar20 = iVar16;
              do {
                *(undefined4 *)((long)pvVar14 + lVar15 * 8) =
                     *(undefined4 *)((long)pvVar33 + lVar15);
                *(undefined4 *)((long)pvVar14 + lVar15 * 8 + 4) = *(undefined4 *)(lVar21 + lVar15);
                *(undefined4 *)((long)pvVar14 + lVar15 * 8 + 8) = *(undefined4 *)(lVar19 + lVar15);
                *(undefined4 *)((long)pvVar14 + lVar15 * 8 + 0xc) = *(undefined4 *)(lVar22 + lVar15)
                ;
                *(undefined4 *)((long)pvVar14 + lVar15 * 8 + 0x10) =
                     *(undefined4 *)((long)pvVar13 + lVar15);
                *(undefined4 *)((long)pvVar14 + lVar15 * 8 + 0x14) =
                     *(undefined4 *)(lVar25 + lVar15);
                *(undefined4 *)((long)pvVar14 + lVar15 * 8 + 0x18) =
                     *(undefined4 *)(lVar24 + lVar15);
                *(undefined4 *)((long)pvVar14 + lVar15 * 8 + 0x1c) =
                     *(undefined4 *)(lVar30 + lVar15);
                lVar15 = lVar15 + 4;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            pvVar33 = (void *)((long)pvVar33 + lVar36);
            lVar17 = lVar17 + 1;
            lVar21 = lVar21 + lVar36;
            lVar19 = lVar19 + lVar36;
            lVar22 = lVar22 + lVar36;
            pvVar13 = (void *)((long)pvVar13 + lVar36);
            lVar25 = lVar25 + lVar36;
            lVar24 = lVar24 + lVar36;
            lVar30 = lVar30 + lVar36;
            pvVar14 = (void *)((long)pvVar14 + (long)iVar35 * sVar3);
          } while (lVar17 != iVar18);
        }
        iVar18 = pMVar1->elempack;
        if (((iVar32 == 1) && (iVar18 == 4)) && (iVar35 = pMVar1->h, 0 < (long)iVar35)) {
          pvVar13 = pMVar1->data;
          iVar20 = pMVar1->w;
          sVar3 = pMVar1->elemsize;
          lVar21 = local_60 + (long)pvVar33;
          lVar24 = local_58 + (long)pvVar33;
          lVar30 = local_68 + (long)pvVar33;
          lVar19 = 0;
          do {
            if (0 < iVar16) {
              puVar27 = (undefined4 *)((long)iVar20 * sVar3 * lVar19 + (long)pvVar13);
              lVar22 = 0;
              do {
                *puVar27 = *(undefined4 *)((long)pvVar33 + lVar22 * 4);
                puVar27[1] = *(undefined4 *)(lVar30 + lVar22 * 4);
                puVar27[2] = *(undefined4 *)(lVar24 + lVar22 * 4);
                puVar27[3] = *(undefined4 *)(lVar21 + lVar22 * 4);
                puVar27 = puVar27 + 4;
                lVar22 = lVar22 + 1;
              } while (iVar16 != (int)lVar22);
            }
            pvVar33 = (void *)((long)pvVar33 + lVar11);
            lVar19 = lVar19 + 1;
            lVar21 = lVar21 + lVar11;
            lVar24 = lVar24 + lVar11;
            lVar30 = lVar30 + lVar11;
          } while (lVar19 != iVar35);
        }
        if (iVar32 == iVar18) {
          lVar21 = pMVar1->h * local_38;
          memcpy(pMVar1->data,pvVar33,pMVar1->elemsize * lVar21);
          pvVar33 = (void *)((long)pvVar33 + (long)(int)lVar21 * (long)pMVar1->elempack * 4);
        }
        uVar12 = uVar12 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    piVar7 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_b8._0_8_ != (void *)0x0) {
            free((void *)local_b8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_b8._32_8_)[3])();
        }
      }
    }
    local_78 = 0;
    local_b8._0_8_ = (void *)0x0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_4_ = 0;
    local_b8._40_16_ = ZEXT816(0);
    local_80 = 0;
    if (bVar39) {
      return -100;
    }
  }
  if ((uVar2 == 2) && (iVar10 == 1)) {
    uVar9 = src->h;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    bVar39 = lVar11 != 0;
    if (bVar39) {
      iVar16 = src->w;
      uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar36 = 0;
      lVar11 = 0;
      uVar29 = 0;
      iVar32 = 0;
      do {
        iVar18 = *(int *)(lVar38 + uVar29 * 4);
        if (iVar18 == -0xe9) {
          iVar18 = (int)((ulong)((long)iVar16 - (long)iVar32) / (uVar12 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar36),iVar18,uVar9,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar36) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar36) * *(long *)((long)&pMVar8->cstep + lVar36) ==
            0) {
          return -100;
        }
        iVar32 = iVar32 + iVar18;
        uVar29 = uVar29 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar36 = lVar36 + 0x48;
        bVar39 = uVar29 < uVar12;
      } while (bVar39);
    }
    if (0 < (int)uVar9) {
      uVar12 = 0;
      do {
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar8) {
          pvVar33 = (void *)((long)src->w * uVar12 * src->elemsize + (long)src->data);
          lVar11 = 0x2c;
          uVar29 = 0;
          do {
            lVar36 = (long)*(int *)((long)&pMVar8->data + lVar11);
            memcpy((void *)(uVar12 * lVar36 * *(long *)((long)pMVar8 + lVar11 + -0x1c) +
                           *(long *)((long)pMVar8 + lVar11 + -0x2c)),pvVar33,lVar36 * _elemsize);
            pvVar33 = (void *)((long)pvVar33 +
                              (long)*(int *)((long)&pMVar8->data + lVar11) * uVar5 * 4);
            uVar29 = uVar29 + 1;
            pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar11 = lVar11 + 0x48;
          } while (uVar29 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar9);
    }
    if (bVar39) {
      return -100;
    }
  }
  if ((uVar2 == 3) && (iVar10 == 0)) {
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    bVar39 = lVar11 != 0;
    if (bVar39) {
      iVar16 = src->w;
      iVar32 = src->h;
      iVar18 = src->c;
      uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar36 = 0;
      lVar11 = 0;
      uVar29 = 0;
      iVar35 = 0;
      do {
        uVar9 = *(uint *)(lVar38 + uVar29 * 4);
        uVar6 = (ulong)uVar9;
        if (uVar9 == 0xffffff17) {
          uVar6 = (ulong)(long)(iVar18 * _elempack - iVar35) / (uVar12 + lVar11);
        }
        lVar21 = 1;
        if ((opt->use_packing_layout == true) &&
           (lVar21 = (ulong)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
          lVar21 = 8;
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar36),iVar16,iVar32,
                    (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)(int)lVar21),lVar21 * (_elemsize / uVar5),(int)lVar21,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar36) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar36) * *(long *)((long)&pMVar8->cstep + lVar36) ==
            0) {
          return -100;
        }
        iVar35 = iVar35 + (int)uVar6;
        uVar29 = uVar29 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar36 = lVar36 + 0x48;
        bVar39 = uVar29 < uVar12;
      } while (bVar39);
    }
    local_70 = CONCAT71(local_70._1_7_,bVar39);
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = pMVar8->elempack;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    if (lVar11 != 0) {
      lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      piVar7 = &pMVar8->elempack;
      do {
        if (*piVar7 < iVar16) {
          iVar16 = *piVar7;
        }
        piVar7 = piVar7 + 0x12;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    piVar7 = src->refcount;
    local_b8._0_8_ = src->data;
    local_b8._8_4_ = SUB84(src->refcount,0);
    local_b8._12_4_ = (undefined4)((ulong)src->refcount >> 0x20);
    local_b8._16_4_ = (undefined4)src->elemsize;
    local_b8._20_4_ = (undefined4)(src->elemsize >> 0x20);
    local_b8._24_4_ = src->elempack;
    local_b8._32_8_ = src->allocator;
    local_b8._40_4_ = src->dims;
    local_b8._44_4_ = src->w;
    local_b8._48_4_ = src->h;
    local_b8._52_4_ = src->d;
    local_80 = src->c;
    local_78 = src->cstep;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    if (iVar16 < _elempack) {
      convert_packing(src,(Mat *)local_b8,iVar16,opt);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar8) {
      uVar12 = 0;
      uVar29 = 0;
      do {
        pMVar1 = pMVar8 + uVar12;
        if (((iVar16 == 4) && (pMVar8[uVar12].elempack == 8)) &&
           (iVar32 = pMVar1->c, 0 < (long)iVar32)) {
          iVar18 = pMVar1->h * pMVar1->w;
          pvVar33 = pMVar1->data;
          sVar3 = pMVar1->cstep;
          sVar4 = pMVar1->elemsize;
          lVar11 = local_78 * CONCAT44(local_b8._20_4_,local_b8._16_4_);
          uVar29 = (ulong)(int)uVar29;
          pvVar14 = (void *)((uVar29 + 1) * lVar11 + local_b8._0_8_);
          pvVar13 = (void *)(lVar11 * uVar29 + local_b8._0_8_);
          lVar36 = 0;
          do {
            if (0 < iVar18) {
              lVar21 = 0;
              iVar35 = iVar18;
              do {
                *(undefined4 *)((long)pvVar33 + lVar21 * 2) =
                     *(undefined4 *)((long)pvVar13 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 2 + 4) =
                     *(undefined4 *)((long)pvVar13 + lVar21 + 4);
                *(undefined4 *)((long)pvVar33 + lVar21 * 2 + 8) =
                     *(undefined4 *)((long)pvVar13 + lVar21 + 8);
                *(undefined4 *)((long)pvVar33 + lVar21 * 2 + 0xc) =
                     *(undefined4 *)((long)pvVar13 + lVar21 + 0xc);
                *(undefined4 *)((long)pvVar33 + lVar21 * 2 + 0x10) =
                     *(undefined4 *)((long)pvVar14 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 2 + 0x14) =
                     *(undefined4 *)((long)pvVar14 + lVar21 + 4);
                *(undefined4 *)((long)pvVar33 + lVar21 * 2 + 0x18) =
                     *(undefined4 *)((long)pvVar14 + lVar21 + 8);
                *(undefined4 *)((long)pvVar33 + lVar21 * 2 + 0x1c) =
                     *(undefined4 *)((long)pvVar14 + lVar21 + 0xc);
                lVar21 = lVar21 + 0x10;
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
            }
            uVar29 = uVar29 + 2;
            lVar36 = lVar36 + 1;
            pvVar33 = (void *)((long)pvVar33 + sVar3 * sVar4);
            pvVar14 = (void *)((long)pvVar14 + lVar11 * 2);
            pvVar13 = (void *)((long)pvVar13 + lVar11 * 2);
          } while (lVar36 != iVar32);
        }
        if (((iVar16 == 1) && (pMVar1->elempack == 8)) && (iVar32 = pMVar1->c, 0 < (long)iVar32)) {
          iVar18 = pMVar1->h * pMVar1->w;
          pvVar33 = pMVar1->data;
          sVar3 = pMVar1->cstep;
          sVar4 = pMVar1->elemsize;
          uVar29 = (ulong)(int)uVar29;
          lVar36 = local_78 * CONCAT44(local_b8._20_4_,local_b8._16_4_);
          pvVar23 = (void *)((uVar29 + 7) * lVar36 + local_b8._0_8_);
          lVar11 = lVar36 * 8;
          pvVar26 = (void *)((uVar29 + 6) * lVar36 + local_b8._0_8_);
          pvVar28 = (void *)((uVar29 + 5) * lVar36 + local_b8._0_8_);
          pvVar37 = (void *)((uVar29 + 4) * lVar36 + local_b8._0_8_);
          pvVar31 = (void *)((uVar29 + 3) * lVar36 + local_b8._0_8_);
          pvVar14 = (void *)((uVar29 + 2) * lVar36 + local_b8._0_8_);
          pvVar34 = (void *)((uVar29 + 1) * lVar36 + local_b8._0_8_);
          pvVar13 = (void *)(lVar36 * uVar29 + local_b8._0_8_);
          lVar36 = 0;
          do {
            if (0 < iVar18) {
              lVar21 = 0;
              iVar35 = iVar18;
              do {
                *(undefined4 *)((long)pvVar33 + lVar21 * 8) =
                     *(undefined4 *)((long)pvVar13 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 8 + 4) =
                     *(undefined4 *)((long)pvVar34 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 8 + 8) =
                     *(undefined4 *)((long)pvVar14 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 8 + 0xc) =
                     *(undefined4 *)((long)pvVar31 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 8 + 0x10) =
                     *(undefined4 *)((long)pvVar37 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 8 + 0x14) =
                     *(undefined4 *)((long)pvVar28 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 8 + 0x18) =
                     *(undefined4 *)((long)pvVar26 + lVar21);
                *(undefined4 *)((long)pvVar33 + lVar21 * 8 + 0x1c) =
                     *(undefined4 *)((long)pvVar23 + lVar21);
                lVar21 = lVar21 + 4;
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
            }
            uVar29 = uVar29 + 8;
            lVar36 = lVar36 + 1;
            pvVar33 = (void *)((long)pvVar33 + sVar3 * sVar4);
            pvVar23 = (void *)((long)pvVar23 + lVar11);
            pvVar26 = (void *)((long)pvVar26 + lVar11);
            pvVar28 = (void *)((long)pvVar28 + lVar11);
            pvVar37 = (void *)((long)pvVar37 + lVar11);
            pvVar31 = (void *)((long)pvVar31 + lVar11);
            pvVar14 = (void *)((long)pvVar14 + lVar11);
            pvVar34 = (void *)((long)pvVar34 + lVar11);
            pvVar13 = (void *)((long)pvVar13 + lVar11);
          } while (lVar36 != iVar32);
        }
        if (((iVar16 == 1) && (pMVar1->elempack == 4)) && (iVar32 = pMVar1->c, 0 < (long)iVar32)) {
          iVar18 = pMVar1->h * pMVar1->w;
          pvVar33 = pMVar1->data;
          sVar3 = pMVar1->cstep;
          sVar4 = pMVar1->elemsize;
          uVar29 = (ulong)(int)uVar29;
          lVar36 = local_78 * CONCAT44(local_b8._20_4_,local_b8._16_4_);
          pvVar23 = (void *)((uVar29 + 3) * lVar36 + local_b8._0_8_);
          lVar11 = lVar36 * 4;
          pvVar26 = (void *)((uVar29 + 2) * lVar36 + local_b8._0_8_);
          pvVar14 = (void *)((uVar29 + 1) * lVar36 + local_b8._0_8_);
          pvVar13 = (void *)(lVar36 * uVar29 + local_b8._0_8_);
          lVar36 = 0;
          do {
            if (0 < iVar18) {
              puVar27 = (undefined4 *)(sVar3 * sVar4 * lVar36 + (long)pvVar33);
              lVar21 = 0;
              do {
                *puVar27 = *(undefined4 *)((long)pvVar13 + lVar21 * 4);
                puVar27[1] = *(undefined4 *)((long)pvVar14 + lVar21 * 4);
                puVar27[2] = *(undefined4 *)((long)pvVar26 + lVar21 * 4);
                puVar27[3] = *(undefined4 *)((long)pvVar23 + lVar21 * 4);
                puVar27 = puVar27 + 4;
                lVar21 = lVar21 + 1;
              } while (iVar18 != (int)lVar21);
            }
            uVar29 = uVar29 + 4;
            lVar36 = lVar36 + 1;
            pvVar23 = (void *)((long)pvVar23 + lVar11);
            pvVar26 = (void *)((long)pvVar26 + lVar11);
            pvVar14 = (void *)((long)pvVar14 + lVar11);
            pvVar13 = (void *)((long)pvVar13 + lVar11);
          } while (lVar36 != iVar32);
        }
        if (iVar16 == pMVar1->elempack) {
          memcpy(pMVar1->data,
                 (void *)(local_78 * (long)(int)uVar29 * CONCAT44(local_b8._20_4_,local_b8._16_4_) +
                         local_b8._0_8_),(long)((int)pMVar1->cstep * pMVar1->c) * pMVar1->elemsize);
          uVar29 = (ulong)(uint)((int)uVar29 + pMVar1->c);
        }
        uVar12 = uVar12 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    piVar7 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_b8._0_8_ != (void *)0x0) {
            free((void *)local_b8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_b8._32_8_)[3])();
        }
      }
    }
    local_78 = 0;
    local_b8._0_8_ = (void *)0x0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_4_ = 0;
    local_b8._40_16_ = ZEXT816(0);
    local_80 = 0;
    if ((char)local_70 != '\0') {
      return -100;
    }
  }
  if ((uVar2 == 3) && (iVar10 == 1)) {
    uVar9 = src->c;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    bVar39 = lVar11 != 0;
    if (bVar39) {
      iVar16 = src->w;
      iVar32 = src->h;
      uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar11 = 0;
      lVar36 = 0;
      uVar29 = 0;
      iVar18 = 0;
      do {
        iVar35 = *(int *)(lVar38 + uVar29 * 4);
        if (iVar35 == -0xe9) {
          iVar35 = (int)((ulong)((long)iVar32 - (long)iVar18) / (uVar12 + lVar36));
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar11),iVar16,iVar35,uVar9,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar11) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar11) * *(long *)((long)&pMVar8->cstep + lVar11) ==
            0) {
          return -100;
        }
        iVar18 = iVar18 + iVar35;
        uVar29 = uVar29 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar36 = lVar36 + -1;
        lVar11 = lVar11 + 0x48;
        bVar39 = uVar29 < uVar12;
      } while (bVar39);
    }
    if (0 < (int)uVar9) {
      uVar12 = 0;
      do {
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar8) {
          pvVar33 = (void *)(src->cstep * uVar12 * src->elemsize + (long)src->data);
          lVar11 = 0x40;
          uVar29 = 0;
          do {
            lVar36 = (long)*(int *)((long)pMVar8 + lVar11 + -0x10) *
                     (long)*(int *)((long)pMVar8 + lVar11 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar8->data + lVar11) * uVar12 *
                            *(long *)((long)pMVar8 + lVar11 + -0x30) +
                           *(long *)((long)pMVar8 + lVar11 + -0x40)),pvVar33,lVar36 * _elemsize);
            pvVar33 = (void *)((long)pvVar33 + (long)((int)lVar36 * _elempack) * 4);
            uVar29 = uVar29 + 1;
            pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar11 = lVar11 + 0x48;
          } while (uVar29 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar9);
    }
    if (bVar39) {
      return -100;
    }
  }
  if ((uVar2 == 3) && (iVar10 == 2)) {
    uVar2 = src->h;
    uVar9 = src->c;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    bVar39 = lVar11 != 0;
    if (bVar39) {
      iVar10 = src->w;
      uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar11 = 0;
      lVar36 = 0;
      uVar29 = 0;
      iVar16 = 0;
      do {
        iVar32 = *(int *)(lVar38 + uVar29 * 4);
        if (iVar32 == -0xe9) {
          iVar32 = (int)((ulong)((long)iVar10 - (long)iVar16) / (uVar12 + lVar36));
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar11),iVar32,uVar2,uVar9,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar11) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar11) * *(long *)((long)&pMVar8->cstep + lVar11) ==
            0) {
          return -100;
        }
        iVar16 = iVar16 + iVar32;
        uVar29 = uVar29 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar36 = lVar36 + -1;
        lVar11 = lVar11 + 0x48;
        bVar39 = uVar29 < uVar12;
      } while (bVar39);
    }
    if (0 < (int)uVar9) {
      uVar12 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar33 = (void *)(src->cstep * uVar12 * src->elemsize + (long)src->data);
          uVar29 = 0;
          do {
            pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar8) {
              lVar38 = 0x40;
              uVar6 = 0;
              do {
                lVar36 = (long)*(int *)((long)pMVar8 + lVar38 + -0x14);
                lVar11 = *(long *)((long)pMVar8 + lVar38 + -0x30);
                memcpy((void *)(uVar29 * lVar36 * lVar11 +
                               *(long *)((long)&pMVar8->data + lVar38) * uVar12 * lVar11 +
                               *(long *)((long)pMVar8 + lVar38 + -0x40)),pvVar33,lVar36 * _elemsize)
                ;
                pvVar33 = (void *)((long)pvVar33 +
                                  (long)*(int *)((long)pMVar8 + lVar38 + -0x14) * uVar5 * 4);
                uVar6 = uVar6 + 1;
                pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar38 = lVar38 + 0x48;
              } while (uVar6 < (ulong)(((long)(top_blobs->
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar2);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar9);
    }
    if (bVar39) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Slice_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}